

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

ClippedEdge *
MutableS2ShapeIndex::ClipVBound(ClippedEdge *edge,int v_end,double v,EdgeAllocator *alloc)

{
  FaceEdge *pFVar1;
  R1Interval *pRVar2;
  ClippedEdge *pCVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int u_end;
  double u;
  FaceEdge *e;
  EdgeAllocator *alloc_local;
  double v_local;
  int v_end_local;
  ClippedEdge *edge_local;
  
  if (v_end == 0) {
    pRVar2 = R2Rect::operator[](&edge->bound,1);
    dVar4 = R1Interval::lo(pRVar2);
    if (v <= dVar4) {
      return edge;
    }
  }
  else {
    pRVar2 = R2Rect::operator[](&edge->bound,1);
    dVar4 = R1Interval::hi(pRVar2);
    if (dVar4 <= v) {
      return edge;
    }
  }
  pFVar1 = edge->face_edge;
  pRVar2 = R2Rect::operator[](&edge->bound,0);
  dVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->a,1);
  dVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->b,1);
  dVar6 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->a,0);
  dVar7 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->b,0);
  dVar4 = S2::InterpolateDouble(v,dVar4,dVar5,dVar6,dVar7);
  dVar4 = R1Interval::Project(pRVar2,dVar4);
  dVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->a,0);
  dVar6 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->b,0);
  dVar7 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->a,1);
  dVar8 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&pFVar1->b,1);
  pCVar3 = UpdateBound(edge,v_end ^ (uint)(dVar6 < dVar5 != dVar8 < dVar7),dVar4,v_end,v,alloc);
  return pCVar3;
}

Assistant:

const MutableS2ShapeIndex::ClippedEdge*
MutableS2ShapeIndex::ClipVBound(const ClippedEdge* edge, int v_end, double v,
                                EdgeAllocator* alloc) {
  // See comments in ClipUBound.
  if (v_end == 0) {
    if (edge->bound[1].lo() >= v) return edge;
  } else {
    if (edge->bound[1].hi() <= v) return edge;
  }
  const FaceEdge& e = *edge->face_edge;
  double u = edge->bound[0].Project(
      S2::InterpolateDouble(v, e.a[1], e.b[1], e.a[0], e.b[0]));
  int u_end = v_end ^ ((e.a[0] > e.b[0]) != (e.a[1] > e.b[1]));
  return UpdateBound(edge, u_end, u, v_end, v, alloc);
}